

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

ImVec2 ImGui::ScrollToBringRectIntoView(ImGuiWindow *window,ImRect *item_rect)

{
  ImGuiWindow *window_00;
  bool bVar1;
  ImVec2 local_90;
  ImVec2 local_88;
  ImRect local_80;
  ImVec2 local_70;
  ImVec2 local_68;
  ImVec2 local_60;
  ImVec2 next_scroll;
  ImVec2 local_50;
  ImVec2 local_48;
  ImVec2 local_40;
  undefined1 local_38 [8];
  ImRect window_rect;
  ImGuiContext *g;
  ImRect *item_rect_local;
  ImGuiWindow *window_local;
  ImVec2 delta_scroll;
  
  window_rect.Max = (ImVec2)GImGui;
  ImVec2::ImVec2(&local_48,1.0,1.0);
  local_40 = operator-(&(window->InnerRect).Min,&local_48);
  ImVec2::ImVec2(&next_scroll,1.0,1.0);
  local_50 = operator+(&(window->InnerRect).Max,&next_scroll);
  ImRect::ImRect((ImRect *)local_38,&local_40,&local_50);
  ImVec2::ImVec2((ImVec2 *)&window_local);
  bVar1 = ImRect::Contains((ImRect *)local_38,item_rect);
  if (!bVar1) {
    if (((window->ScrollbarX & 1U) == 0) || ((float)local_38._0_4_ <= (item_rect->Min).x)) {
      if (((window->ScrollbarX & 1U) != 0) && (window_rect.Min.x <= (item_rect->Max).x)) {
        SetScrollFromPosX(window,((item_rect->Max).x - (window->Pos).x) +
                                 *(float *)((long)window_rect.Max + 0x1688),1.0);
      }
    }
    else {
      SetScrollFromPosX(window,((item_rect->Min).x - (window->Pos).x) -
                               *(float *)((long)window_rect.Max + 0x1688),0.0);
    }
    if ((float)local_38._4_4_ <= (item_rect->Min).y) {
      if (window_rect.Min.y <= (item_rect->Max).y) {
        SetScrollFromPosY(window,((item_rect->Max).y - (window->Pos).y) +
                                 *(float *)((long)window_rect.Max + 0x168c),1.0);
      }
    }
    else {
      SetScrollFromPosY(window,((item_rect->Min).y - (window->Pos).y) -
                               *(float *)((long)window_rect.Max + 0x168c),0.0);
    }
    local_60 = CalcNextScrollFromScrollTargetAndClamp(window);
    local_68 = operator-(&local_60,&window->Scroll);
    window_local = (ImGuiWindow *)local_68;
  }
  if ((window->Flags & 0x1000000U) != 0) {
    window_00 = window->ParentWindow;
    local_88 = operator-(&item_rect->Min,(ImVec2 *)&window_local);
    local_90 = operator-(&item_rect->Max,(ImVec2 *)&window_local);
    ImRect::ImRect(&local_80,&local_88,&local_90);
    local_70 = ScrollToBringRectIntoView(window_00,&local_80);
    operator+=((ImVec2 *)&window_local,&local_70);
  }
  return (ImVec2)window_local;
}

Assistant:

ImVec2 ImGui::ScrollToBringRectIntoView(ImGuiWindow* window, const ImRect& item_rect)
{
    ImGuiContext& g = *GImGui;
    ImRect window_rect(window->InnerRect.Min - ImVec2(1, 1), window->InnerRect.Max + ImVec2(1, 1));
    //GetForegroundDrawList(window)->AddRect(window_rect.Min, window_rect.Max, IM_COL32_WHITE); // [DEBUG]

    ImVec2 delta_scroll;
    if (!window_rect.Contains(item_rect))
    {
        if (window->ScrollbarX && item_rect.Min.x < window_rect.Min.x)
            SetScrollFromPosX(window, item_rect.Min.x - window->Pos.x - g.Style.ItemSpacing.x, 0.0f);
        else if (window->ScrollbarX && item_rect.Max.x >= window_rect.Max.x)
            SetScrollFromPosX(window, item_rect.Max.x - window->Pos.x + g.Style.ItemSpacing.x, 1.0f);
        if (item_rect.Min.y < window_rect.Min.y)
            SetScrollFromPosY(window, item_rect.Min.y - window->Pos.y - g.Style.ItemSpacing.y, 0.0f);
        else if (item_rect.Max.y >= window_rect.Max.y)
            SetScrollFromPosY(window, item_rect.Max.y - window->Pos.y + g.Style.ItemSpacing.y, 1.0f);

        ImVec2 next_scroll = CalcNextScrollFromScrollTargetAndClamp(window);
        delta_scroll = next_scroll - window->Scroll;
    }

    // Also scroll parent window to keep us into view if necessary
    if (window->Flags & ImGuiWindowFlags_ChildWindow)
        delta_scroll += ScrollToBringRectIntoView(window->ParentWindow, ImRect(item_rect.Min - delta_scroll, item_rect.Max - delta_scroll));

    return delta_scroll;
}